

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo
          (RpcConnectionState *this,Reader *disembargo)

{
  RpcClient *pRVar1;
  StringPtr id;
  int iVar2;
  bool bVar3;
  Which WVar4;
  Which WVar5;
  uint32_t uVar6;
  Tag TVar7;
  uint uVar8;
  Tag TVar9;
  QuestionId value;
  Own<capnp::ClientHook,_std::nullptr_t> *other;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> **ppOVar10;
  Export **ppEVar11;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> **ppOVar12;
  OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
  *this_00;
  Connection *pCVar13;
  size_t sVar14;
  OutgoingRpcMessage *pOVar15;
  RpcClient **ppRVar16;
  Answer **ppAVar17;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> **ppRVar18;
  Provide **ppPVar19;
  PromiseFulfiller<void> *pPVar20;
  Fault local_510;
  Fault f_4;
  Fault f_3;
  Fault local_4e0;
  undefined1 local_4d8 [8];
  undefined1 local_4d0 [8];
  Provide *_kj_result_6;
  ThirdPartyEmbargo *embargo_1;
  Fault local_4b8;
  Maybe<kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_&> local_4b0;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *local_4a8;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *_kj_result_5;
  Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *provision_1;
  Fault local_490;
  undefined1 local_488 [16];
  Answer *_kj_result_4;
  Answer *answer;
  Fault f_2;
  undefined1 local_460 [7];
  DebugExpression<bool> _kjCondition_1;
  Reader promisedAnswer;
  Fault f_1;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> local_400;
  DebugExpression<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> local_3f0;
  undefined1 local_3e0 [8];
  DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
  _kjCondition;
  RpcClient **_kj_switch_done_3;
  RpcClient **import;
  Builder local_378;
  undefined1 local_350 [8];
  QuestionRef **_kj_switch_done_2;
  QuestionRef **question;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
  *_kj_switch_subject_1;
  Builder local_328;
  Builder local_300;
  BuilderFor<capnp::rpc::Message> local_2e8;
  undefined1 local_2c0 [8];
  Builder nextDisembargo;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> nextMsg;
  Connection *c;
  Connection *_c4275;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
  local_270;
  undefined1 local_260 [24];
  undefined1 local_248 [16];
  RpcClient *_kj_result_3;
  RpcClient *client;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> *_kj_switch_done_1;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> *contact;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
  local_218;
  undefined1 local_208 [16];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *_kj_switch_done;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *provision;
  OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
  *_kj_switch_subject;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
  nextTarget;
  Maybe<capnp::_::VatNetworkBase::Connection_&> nextConn;
  Fault local_1c8;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *local_1c0;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *_kj_result_2;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *vineInfo;
  Fault local_1a8;
  undefined1 local_1a0 [16];
  Export *_kj_result_1;
  Export *exp;
  Reader target_1;
  undefined8 uStack_150;
  undefined1 auStack_148 [8];
  StringPtr embargoId_1;
  Fault local_130;
  Fault f;
  undefined1 local_111;
  undefined1 local_110 [16];
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *local_100;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *_kj_result;
  Embargo *embargo;
  undefined8 local_e8;
  Embargo *_embargo4238;
  undefined4 local_d8;
  Own<capnp::ClientHook,_std::nullptr_t> local_d0;
  Promise<void> local_c0 [2];
  undefined1 local_b0 [16];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_rpc_c__:4183:19),_void>
  promise;
  undefined1 local_88 [4];
  EmbargoId embargoId;
  undefined1 local_58 [8];
  Own<capnp::ClientHook,_std::nullptr_t> target;
  Reader context;
  Reader *disembargo_local;
  RpcConnectionState *this_local;
  
  rpc::Disembargo::Reader::getContext((Reader *)&target.ptr,disembargo);
  WVar4 = rpc::Disembargo::Context::Reader::which((Reader *)&target.ptr);
  if (WVar4 == SENDER_LOOPBACK) {
    rpc::Disembargo::Reader::getTarget((Reader *)local_88,disembargo);
    getMessageTarget((RpcConnectionState *)local_58,(Reader *)this);
    uVar6 = rpc::Disembargo::Context::Reader::getSenderLoopback((Reader *)&target.ptr);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_58);
    ClientHook::whenResolved((ClientHook *)local_b0);
    kj::Promise<void>::
    then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_1_>
              ((Promise<void> *)(local_b0 + 8),(Type *)local_b0);
    kj::Promise<void>::~Promise((Promise<void> *)local_b0);
    _embargo4238 = (Embargo *)this;
    local_d8 = uVar6;
    other = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                      ((Own<capnp::ClientHook,_std::nullptr_t> *)local_58);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::Own(&local_d0,other);
    kj::Promise<void>::
    then<capnp::_::RpcSystemBase::RpcConnectionState::handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::_lambda()_2_>
              (local_c0,(Type *)(local_b0 + 8));
    kj::TaskSet::add(&this->tasks,local_c0);
    kj::Promise<void>::~Promise(local_c0);
    handleDisembargo(capnp::rpc::Disembargo::Reader_const&)::{lambda()#2}::~Reader
              ((_lambda___2_ *)&_embargo4238);
    kj::Promise<void>::~Promise((Promise<void> *)(local_b0 + 8));
    kj::Own<capnp::ClientHook,_std::nullptr_t>::~Own
              ((Own<capnp::ClientHook,_std::nullptr_t> *)local_58);
  }
  else {
    iVar2 = (int)this;
    if (WVar4 == RECEIVER_LOOPBACK) {
      rpc::Disembargo::Context::Reader::getReceiverLoopback((Reader *)&target.ptr);
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::find
                ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)
                 &embargo,iVar2 + 0xa40);
      _kj_result = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
                   kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>
                             ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Embargo_&> *)
                              &embargo);
      local_e8 = _kj_result;
      if ((Entry *)_kj_result == (Entry *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[61]>
                  (&local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x1093,FAILED,(char *)0x0,
                   "\"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.\"",
                   (char (*) [61])"Invalid embargo ID in \'Disembargo.context.receiverLoopback\'.");
        kj::_::Debug::Fault::fatal(&local_130);
      }
      local_100 = kj::_::readMaybe<kj::PromiseFulfiller<void>,decltype(nullptr)>
                            ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)
                             _kj_result);
      if (local_100 == (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)0x0) {
        kj::_::Debug::Fault::Fault
                  ((Fault *)(local_110 + 8),
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x108f,FAILED,"embargo.fulfiller != nullptr","");
        kj::_::Debug::Fault::fatal((Fault *)(local_110 + 8));
      }
      ppOVar10 = kj::mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>*>(&local_100);
      local_110._0_8_ = *ppOVar10;
      pPVar20 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                          ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_110._0_8_);
      (*(pPVar20->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar20,&local_111);
      uVar6 = rpc::Disembargo::Context::Reader::getReceiverLoopback((Reader *)&target.ptr);
      anon_unknown_18::
      ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::erase
                ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)
                 &f,iVar2 + 0xa40,(Embargo *)(ulong)uVar6);
      Embargo::~Embargo((Embargo *)&f);
      checkIfBecameIdle(this);
    }
    else {
      if (WVar4 != ACCEPT) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,char_const(&)[31],capnp::rpc::Disembargo::Reader_const&>
                  (&local_510,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                   ,0x10e9,FAILED,(char *)0x0,"\"Unimplemented Disembargo type.\", disembargo",
                   (char (*) [31])"Unimplemented Disembargo type.",disembargo);
        kj::_::Debug::Fault::fatal(&local_510);
      }
      join_0x00000010_0x00000000_ =
           (undefined1  [16])rpc::Disembargo::Context::Reader::getAccept((Reader *)&target.ptr);
      auStack_148 = (undefined1  [8])target_1._reader._40_8_;
      embargoId_1.content.ptr = (char *)uStack_150;
      rpc::Disembargo::Reader::getTarget((Reader *)&exp,disembargo);
      WVar5 = rpc::MessageTarget::Reader::which((Reader *)&exp);
      if (WVar5 == IMPORTED_CAP) {
        rpc::MessageTarget::Reader::getImportedCap((Reader *)&exp);
        anon_unknown_18::
        ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::find
                  ((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *
                   )local_1a0,iVar2 + 0x1b8);
        local_1a0._8_8_ =
             kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Export>
                       ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Export_&> *)local_1a0);
        if ((Export *)local_1a0._8_8_ == (Export *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x109f,FAILED,"exports.find(target.getImportedCap()) != nullptr",
                     "\"Message target is not a current export ID.\"",
                     (char (*) [43])"Message target is not a current export ID.");
          kj::_::Debug::Fault::fatal(&local_1a8);
        }
        ppEVar11 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Export*>
                             ((Export **)(local_1a0 + 8));
        vineInfo = (Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)
                   *ppEVar11;
        _kj_result_1 = (Export *)vineInfo;
        local_1c0 = kj::_::
                    readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,decltype(nullptr)>
                              (&((Export *)vineInfo)->vineInfo);
        if (local_1c0 ==
            (Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t> *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                    (&local_1c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10a1,FAILED,"exp.vineInfo != nullptr","\"Disembargo target is not a vine.\""
                     ,(char (*) [33])"Disembargo target is not a vine.");
          kj::_::Debug::Fault::fatal(&local_1c8);
        }
        ppOVar12 = kj::
                   mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,decltype(nullptr)>*>
                             (&local_1c0);
        _kj_result_2 = *ppOVar12;
        kj::Maybe<capnp::_::VatNetworkBase::Connection_&>::Maybe
                  ((Maybe<capnp::_::VatNetworkBase::Connection_&> *)&nextTarget.field_1);
        kj::
        OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
        ::OneOf((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                 *)&_kj_switch_subject);
        this_00 = &kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::VineInfo,_std::nullptr_t>::
                   operator->(_kj_result_2)->info;
        provision = (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *
                    )kj::
                     OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
                     ::_switchSubject(this_00);
        TVar7 = kj::
                OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
                ::which((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>,_kj::Own<capnp::AnyPointer::Reader,_std::nullptr_t>_>
                         *)provision);
        if (TVar7 == _variant0) {
          local_208._8_8_ =
               kj::
               OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
               ::
               get<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>>
                         ((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                           *)provision);
          _kj_switch_done =
               (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
               local_208._8_8_;
          while ((Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 local_208._8_8_ !=
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 0x0) {
            kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>::
            operator->(_kj_switch_done);
            QuestionRef::tryGetConnection((QuestionRef *)local_208);
            kj::Maybe<capnp::_::VatNetworkBase::Connection_&>::operator=
                      ((Maybe<capnp::_::VatNetworkBase::Connection_&> *)&nextTarget.field_1,
                       (Maybe<capnp::_::VatNetworkBase::Connection_&> *)local_208);
            contact = (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)
                      kj::
                      Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t>
                      ::get(_kj_switch_done);
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
            ::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,int>
                      ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                        *)&local_218,(QuestionRef **)&contact);
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
            ::operator=((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                         *)&_kj_switch_subject,&local_218);
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
            ::~OneOf(&local_218);
            local_208._8_8_ =
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,_std::nullptr_t> *)
                 0x0;
          }
        }
        else if (TVar7 == _variant1) {
          client = (RpcClient *)
                   kj::
                   OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                   ::get<kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                             ((OneOf<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef,decltype(nullptr)>,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>>
                               *)provision);
          _kj_switch_done_1 = (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)client;
          while (client != (RpcClient *)0x0) {
            kj::Own<capnp::ClientHook,_std::nullptr_t>::operator*(&_kj_result_1->clientHook);
            unwrapIfSameNetwork((RpcConnectionState *)local_248,(ClientHook *)this);
            local_248._8_8_ =
                 kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient>
                           ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_&> *)
                            local_248);
            if ((RpcClient *)local_248._8_8_ == (RpcClient *)0x0) {
              kj::_::Debug::Fault::Fault
                        ((Fault *)(local_260 + 0x10),
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                         ,0x10ad,FAILED,"unwrapIfSameNetwork(*exp.clientHook) != nullptr","");
              kj::_::Debug::Fault::fatal((Fault *)(local_260 + 0x10));
            }
            ppRVar16 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                                 ((RpcClient **)(local_248 + 8));
            local_260._8_8_ = *ppRVar16;
            _kj_result_3 = (RpcClient *)local_260._8_8_;
            kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                      (&((RpcClient *)local_260._8_8_)->connectionState);
            tryGetConnection((RpcConnectionState *)local_260);
            kj::Maybe<capnp::_::VatNetworkBase::Connection_&>::operator=
                      ((Maybe<capnp::_::VatNetworkBase::Connection_&> *)&nextTarget.field_1,
                       (Maybe<capnp::_::VatNetworkBase::Connection_&> *)local_260);
            _c4275 = (Connection *)_kj_result_3;
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
            ::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*,int>
                      ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                        *)&local_270,(RpcClient **)&_c4275);
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
            ::operator=((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                         *)&_kj_switch_subject,&local_270);
            kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
            ::~OneOf(&local_270);
            client = (RpcClient *)0x0;
          }
        }
        pCVar13 = kj::_::readMaybe<capnp::_::VatNetworkBase::Connection>
                            ((Maybe<capnp::_::VatNetworkBase::Connection_&> *)&nextTarget.field_1);
        if (pCVar13 != (Connection *)0x0) {
          uVar8 = anon_unknown_18::messageSizeHint<capnp::rpc::Disembargo>();
          sVar14 = kj::ArrayPtr<const_unsigned_char>::size
                             ((ArrayPtr<const_unsigned_char> *)auStack_148);
          (**pCVar13->_vptr_Connection)
                    (&nextDisembargo._builder.dataSize,pCVar13,
                     (ulong)(uVar8 + 0x15 + (int)(sVar14 >> 3)));
          pOVar15 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                              ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)
                               &nextDisembargo._builder.dataSize);
          (**pOVar15->_vptr_OutgoingRpcMessage)(&local_300);
          AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_2e8,&local_300);
          rpc::Message::Builder::initDisembargo((Builder *)local_2c0,&local_2e8);
          rpc::Disembargo::Builder::getContext(&local_328,(Builder *)local_2c0);
          Data::Reader::Reader
                    ((Reader *)&_kj_switch_subject_1,(ArrayPtr<const_unsigned_char> *)auStack_148);
          rpc::Disembargo::Context::Builder::setAccept
                    (&local_328,(Reader_conflict)__kj_switch_subject_1);
          question = (QuestionRef **)
                     kj::
                     OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                     ::_switchSubject((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                                       *)&_kj_switch_subject);
          TVar9 = kj::
                  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                  ::which((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                           *)question);
          if (TVar9 == _variant0) {
            local_350 = (undefined1  [8])
                        kj::
                        OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                        ::get<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*>
                                  ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                                    *)question);
            _kj_switch_done_2 = (QuestionRef **)local_350;
            while (local_350 != (undefined1  [8])0x0) {
              rpc::Disembargo::Builder::initTarget((Builder *)&import,(Builder *)local_2c0);
              rpc::MessageTarget::Builder::initPromisedAnswer(&local_378,(Builder *)&import);
              value = QuestionRef::getId(*_kj_switch_done_2);
              rpc::PromisedAnswer::Builder::setQuestionId(&local_378,value);
              local_350 = (undefined1  [8])0x0;
            }
          }
          else if (TVar9 == _variant1) {
            ppRVar16 = kj::
                       OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                       ::get<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                                 ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef*,capnp::_::RpcSystemBase::RpcConnectionState::RpcClient*>
                                   *)question);
            _kjCondition._40_8_ = ppRVar16;
            while (_kjCondition._40_8_ != 0) {
              pRVar1 = *ppRVar16;
              rpc::Disembargo::Builder::initTarget((Builder *)&f_1,(Builder *)local_2c0);
              (*(pRVar1->super_ClientHook)._vptr_ClientHook[10])(&local_400);
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&local_3f0,
                         (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)&kj::_::MAGIC_ASSERT)
              ;
              kj::_::DebugExpression<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>>::
              operator==((DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                          *)local_3e0,
                         (DebugExpression<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>> *
                         )&local_3f0,(None *)&kj::none);
              kj::_::DebugExpression<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::
              ~DebugExpression(&local_3f0);
              kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>::~Maybe(&local_400);
              bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3e0);
              if (!bVar3) {
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::None_const&>&>
                          ((Fault *)&promisedAnswer._reader.nestingLimit,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                           ,0x10c0,FAILED,
                           "import->writeTarget(nextDisembargo.initTarget()) == kj::none",
                           "_kjCondition,",
                           (DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                            *)local_3e0);
                kj::_::Debug::Fault::fatal((Fault *)&promisedAnswer._reader.nestingLimit);
              }
              kj::_::
              DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
              ::~DebugComparison((DebugComparison<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>,_const_kj::None_&>
                                  *)local_3e0);
              _kjCondition.result = false;
              _kjCondition._41_7_ = 0;
            }
          }
          pOVar15 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                              ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)
                               &nextDisembargo._builder.dataSize);
          (*pOVar15->_vptr_OutgoingRpcMessage[2])();
          kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
                    ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)
                     &nextDisembargo._builder.dataSize);
        }
        kj::
        OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
        ::~OneOf((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::QuestionRef_*,_capnp::_::RpcSystemBase::RpcConnectionState::RpcClient_*>
                  *)&_kj_switch_subject);
      }
      else {
        if (WVar5 != PROMISED_ANSWER) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,char_const(&)[29],capnp::rpc::MessageTarget::Reader&>
                    (&f_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10e2,FAILED,(char *)0x0,"\"Unknown message target type.\", target",
                     (char (*) [29])"Unknown message target type.",(Reader *)&exp);
          kj::_::Debug::Fault::fatal(&f_4);
        }
        rpc::MessageTarget::Reader::getPromisedAnswer((Reader *)local_460,(Reader *)&exp);
        bVar3 = rpc::PromisedAnswer::Reader::hasTransform((Reader *)local_460);
        f_2.exception._6_1_ = (bVar3 ^ 0xffU) & 1;
        f_2.exception._7_1_ =
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (bool *)((long)&f_2.exception + 6));
        bVar3 = kj::_::DebugExpression::operator_cast_to_bool
                          ((DebugExpression *)((long)&f_2.exception + 7));
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[70]>
                    ((Fault *)&answer,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d0,FAILED,"!promisedAnswer.hasTransform()",
                     "_kjCondition,\"Disembargo sent to Provide operation cannot include a transformation.\""
                     ,(DebugExpression<bool> *)((long)&f_2.exception + 7),
                     (char (*) [70])
                     "Disembargo sent to Provide operation cannot include a transformation.");
          kj::_::Debug::Fault::fatal((Fault *)&answer);
        }
        rpc::PromisedAnswer::Reader::getQuestionId((Reader *)local_460);
        anon_unknown_18::
        ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::find
                  ((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *
                   )local_488,iVar2 + 0x2d8);
        local_488._8_8_ =
             kj::_::readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer>
                       ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Answer_&> *)local_488);
        if ((Answer *)local_488._8_8_ == (Answer *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70]>
                    (&local_490,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d3,FAILED,"answers.find(promisedAnswer.getQuestionId()) != nullptr",
                     "\"Disembargo specified a provision ID (question ID) that doesn\'t exist.\"",
                     (char (*) [70])
                     "Disembargo specified a provision ID (question ID) that doesn\'t exist.");
          kj::_::Debug::Fault::fatal(&local_490);
        }
        ppAVar17 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Answer*>
                             ((Answer **)(local_488 + 8));
        provision_1 = (Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *)
                      *ppAVar17;
        _kj_result_4 = (Answer *)provision_1;
        kj::
        OneOf<kj::Promise<void>,capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>,kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>>
        ::tryGet<kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>>
                  ((OneOf<kj::Promise<void>,capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,decltype(nullptr)>>,kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>>
                    *)&local_4b0);
        local_4a8 = kj::_::
                    readMaybe<kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>>
                              (&local_4b0);
        if (local_4a8 ==
            (Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *)0x0) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[78]>
                    (&local_4b8,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d6,FAILED,"answer.task.tryGet<Answer::Provide>() != nullptr",
                     "\"Disembargo specified a question ID that didn\'t belong to a Provide operation.\""
                     ,(char (*) [78])
                      "Disembargo specified a question ID that didn\'t belong to a Provide operation."
                    );
          kj::_::Debug::Fault::fatal(&local_4b8);
        }
        ppRVar18 = kj::
                   mv<kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>*>
                             (&local_4a8);
        embargo_1 = (ThirdPartyEmbargo *)*ppRVar18;
        _kj_result_5 = (Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *)
                       embargo_1;
        kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>::operator->
                  ((Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue> *)
                   embargo_1);
        kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide>::
        tryGet<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide>
                  ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide>
                    *)local_4d8);
        local_4d0 = (undefined1  [8])
                    kj::_::
                    readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide>
                              ((Maybe<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide_&>
                                *)local_4d8);
        if (local_4d0 == (undefined1  [8])0x0) {
          kj::_::Debug::Fault::Fault
                    (&local_4e0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                     ,0x10d9,FAILED,
                     "provision->value.tryGet<ThirdPartyExchangeValue::Provide>() != nullptr","");
          kj::_::Debug::Fault::fatal(&local_4e0);
        }
        ppPVar19 = kj::
                   mv<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue::Provide*>
                             ((Provide **)local_4d0);
        id.content.size_ = (size_t)embargoId_1.content.ptr;
        id.content.ptr = (char *)auStack_148;
        _kj_result_6 = (Provide *)
                       ThirdPartyExchangeValue::Provide::findOrCreateThirdPartyEmbargo(*ppPVar19,id)
        ;
        pPVar20 = kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                            ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)
                             &_kj_result_6->embargoes);
        (*(pPVar20->super_PromiseRejector)._vptr_PromiseRejector[2])
                  (pPVar20,(undefined1 *)((long)&f_3.exception + 7));
      }
    }
  }
  return;
}

Assistant:

void handleDisembargo(const rpc::Disembargo::Reader& disembargo) {
    auto context = disembargo.getContext();
    switch (context.which()) {
      case rpc::Disembargo::Context::SENDER_LOOPBACK: {
        kj::Own<ClientHook> target = getMessageTarget(disembargo.getTarget());

        EmbargoId embargoId = context.getSenderLoopback();

        // It's possible that `target` is a promise capability that hasn't resolved yet, in which
        // case we must wait for the resolution. In particular this can happen in the case where
        // we have Alice -> Bob -> Carol, Alice makes a call that proxies from Bob to Carol, and
        // Carol returns a capability from this call that points all the way back though Bob to
        // Alice. When this return capability passes through Bob, Bob will resolve the previous
        // promise-pipeline capability to it. However, Bob has to send a Disembargo to Carol before
        // completing this resolution. In the meantime, though, Bob returns the final response to
        // Alice. Alice then *also* sends a Disembargo to Bob. The Alice -> Bob Disembargo might
        // arrive at Bob before the Bob -> Carol Disembargo has resolved, in which case the
        // Disembargo is delivered to a promise capability.
        auto promise = target->whenResolved()
            .then([]() {
          // We also need to insert yieldUntilQueueEmpty() here to make sure that any pending calls
          // towards this cap have had time to find their way through the event loop.
          return kj::yieldUntilQueueEmpty();
        });

        tasks.add(promise.then([this, embargoId, target = kj::mv(target)]() mutable {
          for (;;) {
            KJ_IF_SOME(r, target->getResolved()) {
              target = r.addRef();
            } else {
              break;
            }
          }

          KJ_REQUIRE(unwrapIfSameConnection(*target) != kj::none,
                    "'Disembargo' of type 'senderLoopback' sent to an object that does not point "
                    "back to the sender.") {
            return;
          }

          if (!connection.is<Connected>()) {
            return;
          }

          RpcClient& downcasted = kj::downcast<RpcClient>(*target);

          auto message = connection.get<Connected>().connection->newOutgoingMessage(
              messageSizeHint<rpc::Disembargo>() + MESSAGE_TARGET_SIZE_HINT);
          auto builder = message->getBody().initAs<rpc::Message>().initDisembargo();

          {
            auto redirect = downcasted.writeTarget(builder.initTarget());

            // Disembargoes should only be sent to capabilities that were previously the subject of
            // a `Resolve` message.  But `writeTarget` only ever returns non-null when called on
            // a PromiseClient.  The code which sends `Resolve` and `Return` should have replaced
            // any promise with a direct node in order to solve the Tribble 4-way race condition.
            // See the documentation of Disembargo in rpc.capnp for more.
            KJ_REQUIRE(redirect == kj::none,
                      "'Disembargo' of type 'senderLoopback' sent to an object that does not "
                      "appear to have been the subject of a previous 'Resolve' message.") {
              return;
            }
          }

          builder.getContext().setReceiverLoopback(embargoId);

          message->send();
        }));

        break;
      }

      case rpc::Disembargo::Context::RECEIVER_LOOPBACK: {
        KJ_IF_SOME(embargo, embargoes.find(context.getReceiverLoopback())) {
          KJ_ASSERT_NONNULL(embargo.fulfiller)->fulfill();
          embargoes.erase(context.getReceiverLoopback(), embargo);
          checkIfBecameIdle();
        } else {
          KJ_FAIL_REQUIRE("Invalid embargo ID in 'Disembargo.context.receiverLoopback'.");
        }
        break;
      }